

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_msa_st_h_mips(CPUMIPSState *env,uint32_t wd,target_ulong_conflict addr)

{
  uint mmu_idx;
  TCGMemOpIdx oi;
  long lVar1;
  uintptr_t unaff_retaddr;
  
  lVar1 = (ulong)wd * 0x10;
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  oi = mmu_idx + 0x790;
  ensure_writable_pages(env,addr,mmu_idx,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr,*(uint16_t *)((env->active_fpu).fpr + wd),oi,
             unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 2,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 2),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 4,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 4),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 6,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 6),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 8,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 8),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 10,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 10),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xc,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 0xc),oi,unaff_retaddr);
  helper_be_stw_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xe,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar1 + 0xe),oi,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_h(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_HALF)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[7], oi, GETPC());
#else
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[7], oi, GETPC());
#endif
}